

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  long ******pppppplVar2;
  long *****ppppplVar3;
  long ******pppppplVar4;
  long ******pppppplVar5;
  __pid_t _Var6;
  int *piVar7;
  uint uVar8;
  long ******pppppplVar9;
  void *(*papvVar10) [2];
  int status;
  QUEUE pending;
  int local_3c;
  long *****local_38;
  long *****local_30;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD","src/unix/process.c",0x3e,"void uv__chld(uv_signal_t *, int)")
    ;
  }
  pppppplVar9 = (long ******)handle->loop->process_handles[0][0];
  papvVar10 = handle->loop->process_handles;
  if ((void *(*) [2])pppppplVar9 != papvVar10) {
    local_38 = (long *****)&local_38;
    local_30 = (long *****)&local_38;
    do {
      pppppplVar2 = (long ******)*pppppplVar9;
      do {
        _Var6 = waitpid(*(__pid_t *)(pppppplVar9 + -1),&local_3c,1);
        if (_Var6 != -1) {
          if (_Var6 != 0) {
            *(int *)(pppppplVar9 + 2) = local_3c;
            ppppplVar3 = *pppppplVar9;
            *pppppplVar9[1] = (long ****)ppppplVar3;
            ppppplVar3[1] = (long ****)pppppplVar9[1];
            *pppppplVar9 = (long *****)&local_38;
            pppppplVar9[1] = local_30;
            *local_30 = (long ****)pppppplVar9;
            local_30 = (long *****)pppppplVar9;
          }
          goto LAB_0010dae9;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (*piVar7 != 10) {
        abort();
      }
LAB_0010dae9:
      pppppplVar9 = pppppplVar2;
      pppppplVar4 = (long ******)local_38;
      pppppplVar5 = (long ******)local_30;
    } while ((void *(*) [2])pppppplVar2 != papvVar10);
    while (&local_38 != pppppplVar4) {
      ppppplVar3 = *pppppplVar4;
      *pppppplVar4[1] = (long ****)ppppplVar3;
      ppppplVar3[1] = (long ****)pppppplVar4[1];
      *pppppplVar4 = (long *****)pppppplVar4;
      pppppplVar4[1] = (long *****)pppppplVar4;
      uVar1 = *(uint *)(pppppplVar4 + -4);
      if (((uVar1 >> 0xe & 1) != 0) &&
         (*(uint *)(pppppplVar4 + -4) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
        *(int *)(pppppplVar4[-8] + 1) = *(int *)(pppppplVar4[-8] + 1) + -1;
      }
      if (pppppplVar4[-2] != (long *****)0x0) {
        uVar8 = *(uint *)(pppppplVar4 + 2) & 0x7f;
        uVar1 = *(uint *)(pppppplVar4 + 2) >> 8 & 0xff;
        if (uVar8 != 0) {
          uVar1 = 0;
        }
        if ((int)(uVar8 * 0x1000000 + 0x1000000) < 0x2000000) {
          uVar8 = 0;
        }
        local_38 = (long *****)pppppplVar4;
        local_30 = (long *****)pppppplVar5;
        (*(code *)pppppplVar4[-2])(pppppplVar4 + -10,uVar1,uVar8);
        pppppplVar4 = (long ******)local_38;
        pppppplVar5 = (long ******)local_30;
      }
    }
  }
  return;
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  unsigned int i;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* h;
  QUEUE* q;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  for (i = 0; i < ARRAY_SIZE(loop->process_handles); i++) {
    h = loop->process_handles + i;
    q = QUEUE_HEAD(h);

    while (q != h) {
      process = QUEUE_DATA(q, uv_process_t, queue);
      q = QUEUE_NEXT(q);

      do
        pid = waitpid(process->pid, &status, WNOHANG);
      while (pid == -1 && errno == EINTR);

      if (pid == 0)
        continue;

      if (pid == -1) {
        if (errno != ECHILD)
          abort();
        continue;
      }

      process->status = status;
      QUEUE_REMOVE(&process->queue);
      QUEUE_INSERT_TAIL(&pending, &process->queue);
    }

    while (!QUEUE_EMPTY(&pending)) {
      q = QUEUE_HEAD(&pending);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      process = QUEUE_DATA(q, uv_process_t, queue);
      uv__handle_stop(process);

      if (process->exit_cb == NULL)
        continue;

      exit_status = 0;
      if (WIFEXITED(process->status))
        exit_status = WEXITSTATUS(process->status);

      term_signal = 0;
      if (WIFSIGNALED(process->status))
        term_signal = WTERMSIG(process->status);

      process->exit_cb(process, exit_status, term_signal);
    }
  }
}